

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O1

string * __thiscall
BayesianGameBase::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,BayesianGameBase *this)

{
  ostream *poVar1;
  double *pdVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  double *pdVar5;
  stringstream ss_1;
  stringstream ss;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  undefined1 local_4c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [7];
  ios_base local_448 [264];
  long *local_340;
  long local_338;
  long local_330 [14];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  SoftPrintSummary_abi_cxx11_((string *)local_4c8,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_4c8._0_8_,local_4c8._8_8_);
  if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
    operator_delete((void *)local_4c8._0_8_,local_4b8[0]._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"joint type probs ",0x11);
  if (this->_m_useSparse == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(sparse) ",9);
    std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
    p_Var4 = *(_Base_ptr *)
              ((long)&(this->_m_jTypeProbsSparse).data_.
                      super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                      ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    poVar1 = (ostream *)(local_4c8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"< ",2);
    for (; (_Rb_tree_header *)p_Var4 !=
           &(this->_m_jTypeProbsSparse).data_.
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      if (p_Var4 != *(_Base_ptr *)
                     ((long)&(this->_m_jTypeProbsSparse).data_.
                             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                             ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      }
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::ostream::_M_insert<double>((double)p_Var4[1]._M_parent);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," >",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
    std::ios_base::~ios_base(local_448);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_340,local_338);
    local_4d8[0] = local_330[0];
    local_4e8 = local_340;
    if (local_340 == local_330) goto LAB_003742c8;
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
    pdVar5 = (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"< ",2);
    if (pdVar5 != pdVar2) {
      do {
        if (pdVar5 != (this->_m_jTypeProbs).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,", ",2);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
        std::ostream::_M_insert<double>(*pdVar5);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
        std::ios_base::~ios_base(local_448);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_330,(char *)local_508,local_500);
        if (local_508 != local_4f8) {
          operator_delete(local_508,local_4f8[0] + 1);
        }
        pdVar5 = pdVar5 + 1;
      } while (pdVar5 != pdVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330," >",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
    std::ios_base::~ios_base(local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)local_4e8,local_4e0);
    if (local_4e8 == local_4d8) goto LAB_003742c8;
  }
  operator_delete(local_4e8,local_4d8[0] + 1);
LAB_003742c8:
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameBase::SoftPrint() const
{
    stringstream ss;
    ss << this->SoftPrintSummary();
/*  
    ss << "Bayesian game with "<<_m_nrAgents<<" agents"<<endl;
    ss << "Number of actions ";
    ss << SoftPrintVector(_m_nrActions);
    ss << " ("<< _m_nrJA <<" joint actions)";
    ss << "\nNumber of types ";
    ss << SoftPrintVector(_m_nrTypes);
    ss << " ("<< _m_nrJTypes <<" joint types)"<<endl;
*/    
    ss << "joint type probs ";
    if(_m_useSparse)
        ss << "(sparse) " << SoftPrintVector(_m_jTypeProbsSparse);
    else
        ss << SoftPrintVector(_m_jTypeProbs);
    ss << endl;
    return(ss.str());
}